

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conversion.cpp
# Opt level: O3

string * Conversion::binToHex(string *__return_storage_ptr__,string *bin)

{
  ulong uVar1;
  string aux;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = 0;
  do {
    std::__cxx11::string::string((string *)&local_70,(string *)bin,uVar1,4);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_70,local_70 + local_68);
    binToDec(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    uVar1 = uVar1 + 4;
  } while (uVar1 <= bin->_M_string_length - 4);
  return __return_storage_ptr__;
}

Assistant:

string Conversion::binToHex(string bin){
    string resp;
    for(int i = 0;i <= bin.length()-4;i+=4){
        string aux(bin,i,4);
        int sullivan = binToDec(aux);
        if(sullivan > 9){
            sullivan += 0x37;
        }else{
            sullivan += 0x30;
        }
        resp += sullivan;
    }
    return resp;
}